

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O3

C * __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::createBuffer
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,size_t length,
          bool saveContents)

{
  int32_t *piVar1;
  C *src;
  FreeFunc *pFVar2;
  size_t sVar3;
  EVP_PKEY_CTX *dst;
  ulong uVar4;
  BufHdr *pBVar5;
  BufHdr *pBVar6;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  sVar3 = length * 4 + 4;
  pBVar6 = (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_hdr;
  if (((pBVar6 != (BufHdr *)0x0) && (uVar4 = pBVar6->m_bufferSize, sVar3 <= uVar4)) &&
     ((pBVar6->super_RefCount).m_refCount == 1)) {
    if (saveContents &&
        (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length != 0) {
      pBVar5 = (BufHdr *)
               (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p;
    }
    else {
      pBVar5 = pBVar6 + 1;
      (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p = (C *)pBVar5;
    }
    if (sVar3 <= (long)pBVar6 + (uVar4 - (long)pBVar5) + 0x28) {
      (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length = length;
      *(C *)((long)&(pBVar5->super_RefCount)._vptr_RefCount + length * 4) = 0;
      (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_isNullTerminated
           = true;
      return (C *)pBVar5;
    }
  }
  sVar3 = getAllocSize<4096ul>(sVar3);
  dst = (EVP_PKEY_CTX *)operator_new(sVar3 + 0x28,(nothrow_t *)&std::nothrow);
  *(undefined4 *)(dst + 0x10) = 0;
  *(undefined4 *)(dst + 0x14) = 1;
  *(undefined ***)dst = &PTR__RefCount_0019da48;
  *(size_t *)(dst + 0x18) = sVar3;
  *(undefined8 *)(dst + 0x20) = 0;
  *(code **)(dst + 8) = mem::deallocate;
  local_38.m_p = (BufHdr *)0x0;
  local_38.m_refCount = (RefCount *)0x0;
  rc::Ptr<axl::rc::BufHdr>::copy(&local_38,dst,dst);
  if (local_38.m_p == (BufHdr *)0x0) {
    pBVar6 = (BufHdr *)0x0;
  }
  else {
    pBVar6 = local_38.m_p + 1;
    src = (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p;
    if (saveContents && src != (C *)0x0) {
      uVar4 = (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length;
      if (length <= uVar4) {
        uVar4 = length;
      }
      __wrap_memcpy(pBVar6,src,uVar4 << 2);
    }
    pBVar5 = (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_hdr;
    if (pBVar5 != (BufHdr *)0x0) {
      LOCK();
      piVar1 = &(pBVar5->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(pBVar5->super_RefCount)._vptr_RefCount)(pBVar5);
        LOCK();
        piVar1 = &(pBVar5->super_RefCount).m_weakRefCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (pFVar2 = (pBVar5->super_RefCount).m_freeFunc, pFVar2 != (FreeFunc *)0x0)) {
          (*pFVar2)(pBVar5);
        }
      }
    }
    pBVar5 = local_38.m_p;
    *(C *)((long)&(pBVar6->super_RefCount)._vptr_RefCount + length * 4) = 0;
    (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p = (C *)pBVar6;
    local_38.m_p = (BufHdr *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_hdr = pBVar5;
    (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length = length;
    (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_isNullTerminated =
         true;
  }
  rc::Ptr<axl::rc::BufHdr>::clear(&local_38);
  return (C *)pBVar6;
}

Assistant:

C*
	createBuffer(
		size_t length,
		bool saveContents = false
	) {
		size_t size = (length + 1) * sizeof(C);

		if (this->m_hdr &&
			this->m_hdr->m_bufferSize >= size &&
			this->m_hdr->getRefCount() == 1) {
			if (!this->m_length || !saveContents)
				this->m_p = (C*)(this->m_hdr + 1);

			if (this->m_hdr->getLeftoverBufferSize(this->m_p) >= size) {
				this->m_length = length;
				this->m_p[length] = 0;
				this->m_isNullTerminated = true;
				return this->m_p;
			}
		}

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<rc::BufHdr> hdr = AXL_RC_NEW_ARGS_EXTRA(rc::BufHdr, (bufferSize), bufferSize);
		if (!hdr)
			return NULL;

		C* p = (C*)(hdr + 1);

		if (saveContents && this->m_p) {
			size_t copyLength = AXL_MIN(length, this->m_length);
			Details::copy(p, this->m_p, copyLength);
		}

		if (this->m_hdr)
			this->m_hdr->release();

		p[length] = 0; // ensure zero termination

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_length = length;
		this->m_isNullTerminated = true;
		return p;
	}